

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1TupleType<int,4ul>
          (AsciiParser *this,char sep,
          vector<nonstd::optional_lite::optional<std::array<int,_4UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<int,_4UL>_>_>_>
          *result)

{
  StreamReader *pSVar1;
  bool bVar2;
  ulong uVar3;
  int iVar4;
  char c;
  array<int,_4UL> value;
  char local_61;
  undefined1 local_60 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_50;
  array<int,_4UL> local_40;
  
  if (*(long *)(result + 8) != *(long *)result) {
    *(long *)(result + 8) = *(long *)result;
  }
  bVar2 = SkipWhitespaceAndNewline(this,true);
  if (bVar2) {
    bVar2 = MaybeNone(this);
    if (bVar2) {
      local_60._0_4_ = local_60._0_4_ & 0xffffff00;
      local_60._4_4_ = (anon_struct_4_0_00000001_for___align)0x0;
      local_60._8_4_ = 0;
      local_60._12_4_ = 0;
      aStack_50._M_allocated_capacity._0_4_ = 0;
      ::std::
      vector<nonstd::optional_lite::optional<std::array<int,4ul>>,std::allocator<nonstd::optional_lite::optional<std::array<int,4ul>>>>
      ::emplace_back<nonstd::optional_lite::optional<std::array<int,4ul>>>
                ((vector<nonstd::optional_lite::optional<std::array<int,4ul>>,std::allocator<nonstd::optional_lite::optional<std::array<int,4ul>>>>
                  *)result,(optional<std::array<int,_4UL>_> *)local_60);
    }
    else {
      bVar2 = ParseBasicTypeTuple<int,4ul>(this,&local_40);
      if (bVar2) {
        local_60[0] = true;
        local_60._4_4_ = local_40._M_elems[0];
        local_60._8_4_ = local_40._M_elems[1];
        local_60._12_4_ = local_40._M_elems[2];
        aStack_50._M_allocated_capacity._0_4_ = local_40._M_elems[3];
        ::std::
        vector<nonstd::optional_lite::optional<std::array<int,4ul>>,std::allocator<nonstd::optional_lite::optional<std::array<int,4ul>>>>
        ::emplace_back<nonstd::optional_lite::optional<std::array<int,4ul>>>
                  ((vector<nonstd::optional_lite::optional<std::array<int,4ul>>,std::allocator<nonstd::optional_lite::optional<std::array<int,4ul>>>>
                    *)result,(optional<std::array<int,_4UL>_> *)local_60);
      }
      else {
        local_60._0_8_ = &aStack_50;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_60,"Not starting with the tuple value of requested type.\n","");
        PushError(this,(string *)local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._0_8_ != &aStack_50) {
          operator_delete((void *)local_60._0_8_,
                          CONCAT44(aStack_50._M_allocated_capacity._4_4_,
                                   aStack_50._M_allocated_capacity._0_4_) + 1);
        }
      }
      if (!bVar2) {
        return false;
      }
    }
    do {
      pSVar1 = this->_sr;
      if ((pSVar1->length_ <= pSVar1->idx_) || (pSVar1->binary_[pSVar1->idx_] == '\0'))
      goto LAB_0038d477;
      bVar2 = SkipWhitespaceAndNewline(this,true);
      if (!bVar2) {
        return false;
      }
      bVar2 = Char1(this,&local_61);
      iVar4 = 1;
      if (bVar2) {
        if (local_61 == sep) {
          bVar2 = SkipWhitespaceAndNewline(this,true);
          if (bVar2) {
            bVar2 = MaybeNone(this);
            if (bVar2) {
              local_60._0_4_ = local_60._0_4_ & 0xffffff00;
              local_60._4_4_ = (anon_struct_4_0_00000001_for___align)0x0;
              local_60._8_4_ = 0;
              local_60._12_4_ = 0;
              aStack_50._M_allocated_capacity._0_4_ = 0;
              ::std::
              vector<nonstd::optional_lite::optional<std::array<int,4ul>>,std::allocator<nonstd::optional_lite::optional<std::array<int,4ul>>>>
              ::emplace_back<nonstd::optional_lite::optional<std::array<int,4ul>>>
                        ((vector<nonstd::optional_lite::optional<std::array<int,4ul>>,std::allocator<nonstd::optional_lite::optional<std::array<int,4ul>>>>
                          *)result,(optional<std::array<int,_4UL>_> *)local_60);
            }
            else {
              bVar2 = ParseBasicTypeTuple<int,4ul>(this,&local_40);
              iVar4 = 3;
              if (!bVar2) goto LAB_0038d468;
              local_60[0] = 1;
              local_60._4_4_ = local_40._M_elems[0];
              local_60._8_4_ = local_40._M_elems[1];
              local_60._12_4_ = local_40._M_elems[2];
              aStack_50._M_allocated_capacity._0_4_ = local_40._M_elems[3];
              ::std::
              vector<nonstd::optional_lite::optional<std::array<int,4ul>>,std::allocator<nonstd::optional_lite::optional<std::array<int,4ul>>>>
              ::emplace_back<nonstd::optional_lite::optional<std::array<int,4ul>>>
                        ((vector<nonstd::optional_lite::optional<std::array<int,4ul>>,std::allocator<nonstd::optional_lite::optional<std::array<int,4ul>>>>
                          *)result,(optional<std::array<int,_4UL>_> *)local_60);
            }
            iVar4 = 0;
          }
        }
        else {
          pSVar1 = this->_sr;
          iVar4 = 3;
          if ((0 < (long)pSVar1->idx_) && (uVar3 = pSVar1->idx_ - 1, uVar3 <= pSVar1->length_)) {
            pSVar1->idx_ = uVar3;
          }
        }
      }
LAB_0038d468:
    } while (iVar4 == 0);
    if (iVar4 != 1) {
LAB_0038d477:
      if (*(long *)result != *(long *)(result + 8)) {
        return true;
      }
      local_60._0_8_ = &aStack_50;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"Empty array.\n","");
      PushError(this,(string *)local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._0_8_ != &aStack_50) {
        operator_delete((void *)local_60._0_8_,
                        CONCAT44(aStack_50._M_allocated_capacity._4_4_,
                                 aStack_50._M_allocated_capacity._0_4_) + 1);
      }
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1TupleType(
    const char sep, std::vector<nonstd::optional<std::array<T, N>>> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  if (MaybeNone()) {
    result->push_back(nonstd::nullopt);
  } else {
    std::array<T, N> value;
    if (!ParseBasicTypeTuple<T, N>(&value)) {
      PushError("Not starting with the tuple value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    if (MaybeNone()) {
      result->push_back(nonstd::nullopt);
    } else {
      std::array<T, N> value;
      if (!ParseBasicTypeTuple<T, N>(&value)) {
        break;
      }
      result->push_back(value);
    }
  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}